

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emplace.cc
# Opt level: O2

void _test<phmap::flat_hash_map<int,custom_type_2,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,custom_type_2>>>,int,custom_type_2,void,_emplace>
               (size_t iterations,size_t container_size,char *map_name)

{
  long lVar1;
  ostream *poVar2;
  size_t sVar3;
  size_t j;
  size_t j_00;
  long lVar4;
  _emplace<phmap::flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>,_int,_custom_type_2,_void>
  insert;
  flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
  m;
  _emplace<phmap::flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>,_int,_custom_type_2,_void>
  local_79;
  double local_78;
  long local_70;
  char *local_68;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
  local_60;
  
  local_78 = (double)iterations;
  local_68 = map_name;
  local_70 = std::chrono::_V2::system_clock::now();
  lVar4 = 0;
  for (sVar3 = 0; (double)sVar3 != local_78; sVar3 = sVar3 + 1) {
    local_60.ctrl_ =
         phmap::priv::
         EmptyGroup<std::is_same<std::allocator<std::pair<int_const,custom_type_2>>,std::allocator<std::pair<int_const,custom_type_2>>>>()
         ::empty_group;
    local_60.settings_.
    super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         (_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
          )(_Head_base<0UL,_unsigned_long,_false>)0x0;
    local_60.slots_ = (slot_type *)0x0;
    local_60.size_ = 0;
    local_60.capacity_ = 0;
    for (j_00 = 0; container_size != j_00; j_00 = j_00 + 1) {
      _emplace<phmap::flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>,_int,_custom_type_2,_void>
      ::operator()(&local_79,
                   (flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
                    *)&local_60,j_00);
    }
    lVar4 = lVar4 + local_60.size_;
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
    ::~raw_hash_set(&local_60);
  }
  lVar1 = std::chrono::_V2::system_clock::now();
  if (lVar4 != container_size * (long)local_78) {
    poVar2 = std::operator<<((ostream *)&std::clog,"  invalid count: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n");
  }
  local_78 = (double)(lVar1 - local_70) / 1000000.0;
  poVar2 = std::operator<<((ostream *)&std::clog,local_68);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)local_78);
  std::operator<<(poVar2," ms\n");
  return;
}

Assistant:

void _test(std::size_t iterations, std::size_t container_size, const char *map_name)
{
    std::size_t count = 0;
    auto t1 = std::chrono::high_resolution_clock::now();
    INSERT<Map, K, V, T> insert;
    for (std::size_t i=0; i<iterations; ++i)
    {
        Map m;
        for (std::size_t j=0; j<container_size; ++j)
            insert(m, j);
        count += m.size();
    }
    auto t2 = std::chrono::high_resolution_clock::now();
    auto elapsed = milliseconds<double>(t2 - t1).count();
    if (count != iterations*container_size)
        std::clog << "  invalid count: " << count << "\n";
    std::clog << map_name << std::fixed << int(elapsed) << " ms\n";
}